

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

BOOL __thiscall
Js::GlobalObject::DeleteItem(GlobalObject *this,uint32 index,PropertyOperationFlags flags)

{
  BOOL BVar1;
  int iVar2;
  RecyclableObject *pRVar3;
  
  BVar1 = DynamicObject::DeleteItem((DynamicObject *)this,index,flags);
  if (BVar1 == 0) {
    pRVar3 = (this->directHostObject).ptr;
    if ((pRVar3 != (RecyclableObject *)0x0) ||
       (pRVar3 = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr,
       pRVar3 != (RecyclableObject *)0x0)) {
      iVar2 = (*(pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2a])(pRVar3,(ulong)index,(ulong)flags);
      return iVar2;
    }
    BVar1 = 0;
  }
  else {
    BVar1 = 1;
  }
  return BVar1;
}

Assistant:

BOOL GlobalObject::DeleteItem(uint32 index, PropertyOperationFlags flags)
    {
        if (DynamicObject::DeleteItem(index, flags))
        {
            return TRUE;
        }

        if (this->directHostObject)
        {
            return this->directHostObject->DeleteItem(index, flags);
        }

        if (this->hostObject)
        {
            return this->hostObject->DeleteItem(index, flags);
        }
        return FALSE;
    }